

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_lu.cc
# Opt level: O0

X509_OBJECT * x509_object_dup(X509_OBJECT *obj)

{
  X509_OBJECT *ret;
  X509_OBJECT *obj_local;
  
  obj_local = X509_OBJECT_new();
  if ((X509_OBJECT *)obj_local == (X509_OBJECT *)0x0) {
    obj_local = (X509_OBJECT *)0x0;
  }
  else {
    ((X509_OBJECT *)obj_local)->type = obj->type;
    ((X509_OBJECT *)obj_local)->data = *(_union_381 *)&obj->data;
    X509_OBJECT_up_ref_count((X509_OBJECT *)obj_local);
  }
  return obj_local;
}

Assistant:

static X509_OBJECT *x509_object_dup(const X509_OBJECT *obj) {
  X509_OBJECT *ret = X509_OBJECT_new();
  if (ret == NULL) {
    return NULL;
  }
  ret->type = obj->type;
  ret->data = obj->data;
  X509_OBJECT_up_ref_count(ret);
  return ret;
}